

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

int Au_ObjSuppSize(Au_Obj_t *pObj)

{
  Au_Ntk_t *p;
  int iVar1;
  
  p = *(Au_Ntk_t **)((ulong)pObj & 0xfffffffffffffc00);
  if ((p->vTravIds).pArray == (int *)0x0) {
    Vec_IntFill(&p->vTravIds,(p->vPages).nSize * 0x1000 + p->iHandle + -0xe0c,0);
  }
  iVar1 = p->nTravIds;
  p->nTravIds = iVar1 + 1;
  if (iVar1 < 0x3fffffff) {
    iVar1 = Au_ObjSuppSize_rec(p,(uint)((ulong)pObj >> 4) & 0x3f |
                                 *(uint *)((long)pObj + (8 - (ulong)((uint)pObj & 0x3ff))));
    return iVar1;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                ,0xbf,"void Au_NtkIncrementTravId(Au_Ntk_t *)");
}

Assistant:

int Au_ObjSuppSize( Au_Obj_t * pObj )
{
    Au_Ntk_t * p = Au_ObjNtk(pObj);
    Au_NtkIncrementTravId( p );
    return Au_ObjSuppSize_rec( p, Au_ObjId(pObj) );
}